

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O2

int IDAGetQuadDky(void *ida_mem,sunrealtype t,int k,N_Vector dkyQ)

{
  long lVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  char *msgfmt;
  sunrealtype *psVar7;
  sunrealtype *psVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  sunrealtype cjk [6];
  sunrealtype cjk_1 [6];
  
  psVar8 = cjk;
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    iVar6 = -0x14;
    iVar3 = 0xcb4;
  }
  else if (*(int *)((long)ida_mem + 0x60) == 1) {
    if (dkyQ == (N_Vector)0x0) {
      msgfmt = "dky = NULL illegal.";
      iVar6 = -0x1b;
      iVar3 = 0xcc6;
    }
    else {
      if ((-1 < k) && (k <= *(int *)((long)ida_mem + 0x4b8))) {
        dVar2 = *(double *)((long)ida_mem + 0x4f8);
        if ((t - ((dVar2 + *(double *)((long)ida_mem + 0x4e0)) *
                  *(double *)((long)ida_mem + 8) * -100.0 +
                 (dVar2 - *(double *)((long)ida_mem + 0x4e8)))) * *(double *)((long)ida_mem + 0x4e0)
            < 0.0) {
          IDAProcessError((IDAMem)ida_mem,-0x1a,0xcd9,"IDAGetQuadDky",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                          ,
                          "Illegal value for t.t = %.15g is not between tcur - hold = %.15g and tcur = %.15g"
                         );
          return -0x1a;
        }
        for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
          cjk[lVar4] = 0.0;
          cjk_1[lVar4] = 0.0;
        }
        iVar3 = *(int *)((long)ida_mem + 0x4bc);
        psVar7 = cjk_1;
        iVar6 = 1;
        uVar5 = 0;
        lVar4 = 0x100000000;
        while( true ) {
          psVar7 = psVar7 + 1;
          psVar8 = (sunrealtype *)((long)psVar8 + 8);
          if (uVar5 == k + 1) break;
          if (uVar5 == 0) {
            cjk[0] = 1.0;
            dVar11 = 0.0;
            dVar12 = 0.0;
          }
          else {
            dVar11 = (double)(int)uVar5;
            dVar12 = *(double *)((long)ida_mem + uVar5 * 8 + 0x180);
            cjk[uVar5] = (cjk[uVar5 - 1] * dVar11) / dVar12;
          }
          lVar1 = uVar5 + ((long)iVar3 - (long)k);
          for (lVar9 = (long)iVar6; lVar9 <= lVar1; lVar9 = lVar9 + 1) {
            dVar13 = dVar12 + (t - dVar2);
            dVar12 = *(double *)((long)ida_mem + lVar9 * 8 + 0x180);
            cjk[lVar9] = (cjk[lVar9 + 5] * dVar11 + dVar13 * cjk[lVar9 + -1]) / dVar12;
          }
          lVar10 = 0;
          for (lVar9 = lVar4; lVar9 >> 0x20 <= lVar1; lVar9 = lVar9 + 0x100000000) {
            *(undefined8 *)((long)psVar7 + lVar10) = *(undefined8 *)((long)psVar8 + lVar10);
            lVar10 = lVar10 + 8;
          }
          uVar5 = uVar5 + 1;
          iVar6 = iVar6 + 1;
          lVar4 = lVar4 + 0x100000000;
        }
        iVar3 = N_VLinearCombination
                          ((*(int *)((long)ida_mem + 0x4bc) - k) + 1,cjk + (uint)k,
                           (long)ida_mem + (ulong)(uint)k * 8 + 0x300,dkyQ);
        if (iVar3 != 0) {
          return -0x1c;
        }
        return 0;
      }
      msgfmt = "Illegal value for k.";
      iVar6 = -0x19;
      iVar3 = 0xcce;
    }
  }
  else {
    msgfmt = "Illegal attempt to call before calling IDAQuadInit.";
    iVar6 = -0x1e;
    iVar3 = 0xcbe;
  }
  IDAProcessError((IDAMem)ida_mem,iVar6,iVar3,"IDAGetQuadDky",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return iVar6;
}

Assistant:

int IDAGetQuadDky(void* ida_mem, sunrealtype t, int k, N_Vector dkyQ)
{
  IDAMem IDA_mem;
  sunrealtype tfuzz, tp, delt, psij_1;
  int i, j, retval;
  sunrealtype cjk[MXORDP1];
  sunrealtype cjk_1[MXORDP1];

  /* Check ida_mem */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check if quadrature was initialized */
  if (IDA_mem->ida_quadr != SUNTRUE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUAD, __LINE__, __func__, __FILE__,
                    MSG_NO_QUAD);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_QUAD);
  }

  if (dkyQ == NULL)
  {
    IDAProcessError(IDA_mem, IDA_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_DKY);
  }

  if ((k < 0) || (k > IDA_mem->ida_kk))
  {
    IDAProcessError(IDA_mem, IDA_BAD_K, __LINE__, __func__, __FILE__, MSG_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_K);
  }

  /* Check t for legality.  Here tn - hused is t_{n-1}. */

  tfuzz = HUNDRED * IDA_mem->ida_uround * (IDA_mem->ida_tn + IDA_mem->ida_hh);
  tp    = IDA_mem->ida_tn - IDA_mem->ida_hused - tfuzz;
  if ((t - tp) * IDA_mem->ida_hh < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_BAD_T, __LINE__, __func__, __FILE__, MSG_BAD_T,
                    t, IDA_mem->ida_tn - IDA_mem->ida_hused, IDA_mem->ida_tn);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_T);
  }

  /* Initialize the c_j^(k) and c_k^(k-1) */
  for (i = 0; i < MXORDP1; i++)
  {
    cjk[i]   = 0;
    cjk_1[i] = 0;
  }
  delt = t - IDA_mem->ida_tn;

  for (i = 0; i <= k; i++)
  {
    if (i == 0)
    {
      cjk[i] = 1;
      psij_1 = 0;
    }
    else
    {
      cjk[i] = cjk[i - 1] * i / IDA_mem->ida_psi[i - 1];
      psij_1 = IDA_mem->ida_psi[i - 1];
    }

    /* update c_j^(i) */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++)
    {
      cjk[j] = (i * cjk_1[j - 1] + cjk[j - 1] * (delt + psij_1)) /
               IDA_mem->ida_psi[j - 1];
      psij_1 = IDA_mem->ida_psi[j - 1];
    }

    /* save existing c_j^(i)'s */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++) { cjk_1[j] = cjk[j]; }
  }

  /* Compute sum (c_j(t) * phi(t)) */

  retval = N_VLinearCombination(IDA_mem->ida_kused - k + 1, cjk + k,
                                IDA_mem->ida_phiQ + k, dkyQ);
  if (retval != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_VECTOROP_ERR);
  }

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}